

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenArrayFillSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  if (expr->_id != ArrayFillId) {
    __assert_fail("expression->is<ArrayFill>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x1189,
                  "void BinaryenArrayFillSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x118a,"void BinaryenArrayFillSetRef(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenArrayFillSetRef(BinaryenExpressionRef expr,
                             BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayFill>());
  assert(refExpr);
  static_cast<ArrayFill*>(expression)->ref = (Expression*)refExpr;
}